

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::initRenderShader
          (LayeredRenderCase *this)

{
  bool bVar1;
  TestLog *pTVar2;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  RenderContext *pRVar3;
  ProgramSources *pPVar4;
  TestError *this_01;
  allocator<char> local_279;
  string local_278;
  undefined1 local_255;
  ContextType local_254;
  string local_250;
  ShaderSource local_230;
  ContextType local_204;
  string local_200;
  ShaderSource local_1e0;
  ContextType local_1b8;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  ShaderSource local_170;
  ProgramSources local_148;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ScopedLogSection local_18;
  ScopedLogSection section;
  LayeredRenderCase *this_local;
  
  section.m_log = (TestLog *)this;
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"RenderToTextureShader",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Create layered rendering shader program",&local_71);
  tcu::ScopedLogSection::ScopedLogSection(&local_18,pTVar2,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_255 = 1;
  renderCtx = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,
             "${GLSL_VERSION_DECL}\nvoid main (void)\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n}\n"
             ,&local_1b1);
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_1b8.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  specializeShader(&local_190,&local_1b0,&local_1b8);
  glu::VertexSource::VertexSource((VertexSource *)&local_170,&local_190);
  pPVar4 = glu::ProgramSources::operator<<(&local_148,&local_170);
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_204.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  Functional::(anonymous_namespace)::LayeredRenderCase::genFragmentSource_abi_cxx11_
            (&local_200,this,&local_204);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_1e0,&local_200);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,&local_1e0);
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_254.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  Functional::(anonymous_namespace)::LayeredRenderCase::genGeometrySource_abi_cxx11_
            (&local_250,this,&local_254);
  glu::GeometrySource::GeometrySource((GeometrySource *)&local_230,&local_250);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,&local_230);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar4);
  local_255 = 0;
  this->m_renderShader = this_00;
  glu::GeometrySource::~GeometrySource((GeometrySource *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  glu::VertexSource::~VertexSource((VertexSource *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  glu::ProgramSources::~ProgramSources(&local_148);
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar2,this->m_renderShader);
  bVar1 = glu::ShaderProgram::isOk(this->m_renderShader);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"failed to build render shader",&local_279);
    tcu::TestError::TestError(this_01,&local_278);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_18);
  return;
}

Assistant:

void LayeredRenderCase::initRenderShader (void)
{
	const tcu::ScopedLogSection section(m_testCtx.getLog(), "RenderToTextureShader", "Create layered rendering shader program");

	static const char* const positionVertex =	"${GLSL_VERSION_DECL}\n"
												"void main (void)\n"
												"{\n"
												"	gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
												"}\n";

	m_renderShader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource(specializeShader(positionVertex, m_context.getRenderContext().getType()))
		<< glu::FragmentSource(genFragmentSource(m_context.getRenderContext().getType()))
		<< glu::GeometrySource(genGeometrySource(m_context.getRenderContext().getType())));
	m_testCtx.getLog() << *m_renderShader;

	if (!m_renderShader->isOk())
		throw tcu::TestError("failed to build render shader");
}